

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

int Cec_GiaSplitTestInt(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose
                       ,int fVeryVerbose,int fSilent)

{
  int nVars;
  int nConfs;
  uint uVar1;
  Vec_Int_t *pVVar2;
  bool bVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Aig_Man_t *pAVar9;
  Cnf_Dat_t *pCVar10;
  undefined8 *puVar11;
  Gia_Man_t *pGVar12;
  Vec_Int_t *pVVar13;
  int *piVar14;
  undefined4 extraout_var;
  Gia_Man_t *pGVar15;
  void *pvVar16;
  Par_ThData_t_conflict *pPVar17;
  char *__s;
  long lVar18;
  uint *__ptr;
  ulong uVar19;
  uint uVar20;
  pthread_t *__newthread;
  ulong uVar21;
  Cnf_Dat_t **ppCVar22;
  long lVar23;
  uint local_1378;
  long local_1358;
  uint *local_1348;
  double local_1340;
  timespec ts_2;
  int Cost;
  int nSatConfs;
  int nSatVars;
  void *local_1310;
  ulong local_1308;
  Abc_Cex_t **local_1300;
  Par_ThData_t_conflict ThData [100];
  pthread_t WorkerThread [100];
  
  pPVar17 = ThData;
  iVar5 = clock_gettime(3,(timespec *)pPVar17);
  iVar7 = (int)pPVar17;
  if (iVar5 < 0) {
    local_1358 = -1;
  }
  else {
    local_1358 = (long)ThData[0].pCnf / 1000 + (long)ThData[0].p * 1000000;
  }
  local_1300 = &p->pCexComb;
  Abc_CexFreeP(local_1300);
  if (fVerbose != 0) {
    puts("Solving CEC problem by cofactoring with the following parameters:");
    iVar7 = nProcs;
    printf("Processes = %d   TimeOut = %d sec   MaxIter = %d   LookAhead = %d   Verbose = %d.\n",
           (ulong)(uint)nProcs,(ulong)(uint)nTimeOut,(ulong)(uint)nIterMax,(ulong)(uint)LookAhead,
           fVerbose);
  }
  fflush(_stdout);
  if (nProcs == 1) {
    uVar6 = Cec_GiaSplitTest2(p,iVar7,nTimeOut,nIterMax,LookAhead,fVerbose,fVeryVerbose,fSilent);
    __ptr = (uint *)(ulong)uVar6;
  }
  else {
    if (99 < nProcs - 2U) {
      __assert_fail("nProcs >= 1 && nProcs <= PAR_THR_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                    ,0x250,"int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)"
                   );
    }
    pAVar9 = Gia_ManToAigSimple(p);
    pAVar9->nRegs = 0;
    pCVar10 = Cnf_Derive(pAVar9,0);
    Aig_ManStop(pAVar9);
    iVar7 = Cnf_GiaSolveOne(p,pCVar10,nTimeOut,&nSatVars,&nSatConfs);
    Cnf_DataFree(pCVar10);
    if (iVar7 != -1 && fVerbose != 0) {
      iVar5 = clock_gettime(3,(timespec *)ThData);
      if (iVar5 < 0) {
        lVar18 = -1;
      }
      else {
        lVar18 = (long)ThData[0].pCnf / 1000 + (long)ThData[0].p * 1000000;
      }
      Cec_GiaSplitPrint(0,0,nSatVars,nSatConfs,iVar7,0.0,lVar18 - local_1358);
    }
    if (iVar7 == -1) {
      __ptr = (uint *)malloc(0x10);
      __ptr[0] = 1000;
      __ptr[1] = 0;
      puVar11 = (undefined8 *)malloc(8000);
      *(undefined8 **)(__ptr + 2) = puVar11;
      pGVar12 = Gia_ManDup(p);
      __ptr[1] = 1;
      *puVar11 = pGVar12;
      uVar21 = (ulong)(nProcs - 1);
      if (1 < nProcs) {
        pPVar17 = ThData;
        __newthread = WorkerThread;
        uVar19 = 0;
        do {
          pPVar17->p = (Gia_Man_t *)0x0;
          pPVar17->pCnf = (Cnf_Dat_t *)0x0;
          pPVar17->iThread = (int)uVar19;
          pPVar17->nTimeOut = nTimeOut;
          pPVar17->fWorking = 0;
          pPVar17->Result = -1;
          pPVar17->nVars = -1;
          pPVar17->nConfs = -1;
          iVar7 = pthread_create(__newthread,(pthread_attr_t *)0x0,Cec_GiaSplitWorkerThread,pPVar17)
          ;
          if (iVar7 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                          ,0x272,
                          "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)")
            ;
          }
          uVar19 = uVar19 + 1;
          pPVar17 = pPVar17 + 1;
          __newthread = __newthread + 1;
        } while (uVar21 != uVar19);
      }
      local_1340 = 0.0;
      bVar3 = true;
      local_1348 = (uint *)0xffffffff;
      local_1378 = 0;
      while (bVar3) {
        bVar3 = 0 < (int)__ptr[1];
        if (1 < nProcs) {
          uVar19 = 0;
          do {
            if (ThData[uVar19].fWorking == 0) {
              pPVar17 = ThData + uVar19;
              pGVar12 = pPVar17->p;
              if (pGVar12 != (Gia_Man_t *)0x0) {
                if (pGVar12->vCofVars == (Vec_Int_t *)0x0) {
                  iVar7 = 0;
                  pVVar13 = (Vec_Int_t *)malloc(0x10);
                  pVVar13->nCap = 100;
                  pVVar13->nSize = 0;
                  piVar14 = (int *)malloc(400);
                  pVVar13->pArray = piVar14;
                  pGVar12->vCofVars = pVVar13;
                }
                else {
                  iVar7 = pGVar12->vCofVars->nSize;
                }
                if (fVerbose != 0) {
                  iVar5 = ThData[uVar19].Result;
                  nVars = ThData[uVar19].nVars;
                  nConfs = ThData[uVar19].nConfs;
                  iVar8 = clock_gettime(3,(timespec *)&ts_2);
                  if (iVar8 < 0) {
                    lVar18 = -1;
                  }
                  else {
                    lVar18 = ts_2.tv_nsec / 1000 +
                             CONCAT44(ts_2.tv_sec._4_4_,(uint)ts_2.tv_sec) * 1000000;
                  }
                  Cec_GiaSplitPrint((int)uVar19 + 1,iVar7,nVars,nConfs,iVar5,local_1340,
                                    lVar18 - local_1358);
                }
                if (ThData[uVar19].Result == -1) {
                  iVar7 = Gia_SplitCofVar(pGVar12,LookAhead,(int *)&ts_2,&Cost);
                  local_1308 = CONCAT44(extraout_var,iVar7);
                  pGVar15 = Gia_ManDupCofactorVar(pGVar12,iVar7,0);
                  uVar6 = pGVar12->vCofVars->nSize;
                  iVar7 = uVar6 + 1;
                  pVVar13 = (Vec_Int_t *)malloc(0x10);
                  if (uVar6 < 0xf) {
                    iVar7 = 0x10;
                  }
                  pVVar13->nSize = 0;
                  pVVar13->nCap = iVar7;
                  if (iVar7 == 0) {
                    piVar14 = (int *)0x0;
                  }
                  else {
                    piVar14 = (int *)malloc((long)iVar7 << 2);
                  }
                  pVVar13->pArray = piVar14;
                  pGVar15->vCofVars = pVVar13;
                  pVVar2 = pGVar12->vCofVars;
                  if (0 < pVVar2->nSize) {
                    lVar18 = 0;
                    do {
                      Vec_IntPush(pVVar13,pVVar2->pArray[lVar18]);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < pVVar2->nSize);
                  }
                  iVar7 = (int)local_1308 * 2 + 1;
                  Vec_IntPush(pGVar15->vCofVars,iVar7);
                  uVar6 = __ptr[1];
                  uVar1 = *__ptr;
                  if (uVar6 == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar16 = malloc(0x80);
                      }
                      else {
                        pvVar16 = realloc(*(void **)(__ptr + 2),0x80);
                      }
                      uVar20 = 0x10;
                    }
                    else {
                      uVar20 = uVar1 * 2;
                      if ((int)uVar20 <= (int)uVar1) goto LAB_0065a8b9;
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar16 = malloc((ulong)uVar1 << 4);
                      }
                      else {
                        pvVar16 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
                      }
                    }
                    *(void **)(__ptr + 2) = pvVar16;
                    *__ptr = uVar20;
                  }
LAB_0065a8b9:
                  local_1310 = *(void **)(__ptr + 2);
                  __ptr[1] = uVar6 + 1;
                  *(Gia_Man_t **)((long)local_1310 + (long)(int)uVar6 * 8) = pGVar15;
                  iVar5 = (int)local_1308;
                  if (fVeryVerbose != 0) {
                    printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n"
                           ,local_1308 & 0xffffffff,(ulong)(uint)ts_2.tv_sec,(ulong)(uint)Cost,
                           (ulong)(uint)(~(pGVar12->vCos->nSize + pGVar12->vCis->nSize) +
                                        pGVar12->nObjs),
                           (ulong)(uint)(~(pGVar15->vCos->nSize + pGVar15->vCis->nSize) +
                                        pGVar15->nObjs));
                  }
                  pGVar15 = Gia_ManDupCofactorVar(pGVar12,iVar5,1);
                  uVar1 = pGVar12->vCofVars->nSize;
                  iVar5 = uVar1 + 1;
                  pVVar13 = (Vec_Int_t *)malloc(0x10);
                  if (uVar1 < 0xf) {
                    iVar5 = 0x10;
                  }
                  pVVar13->nSize = 0;
                  pVVar13->nCap = iVar5;
                  if (iVar5 == 0) {
                    piVar14 = (int *)0x0;
                  }
                  else {
                    piVar14 = (int *)malloc((long)iVar5 << 2);
                  }
                  pVVar13->pArray = piVar14;
                  pGVar15->vCofVars = pVVar13;
                  pVVar2 = pGVar12->vCofVars;
                  if (0 < pVVar2->nSize) {
                    lVar18 = 0;
                    do {
                      Vec_IntPush(pVVar13,pVVar2->pArray[lVar18]);
                      lVar18 = lVar18 + 1;
                    } while (lVar18 < pVVar2->nSize);
                  }
                  Vec_IntPush(pGVar15->vCofVars,iVar7);
                  uVar1 = *__ptr;
                  if (uVar6 + 1 == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (local_1310 == (void *)0x0) {
                        pvVar16 = malloc(0x80);
                      }
                      else {
                        pvVar16 = realloc(local_1310,0x80);
                      }
                      uVar20 = 0x10;
                    }
                    else {
                      uVar20 = uVar1 * 2;
                      if ((int)uVar20 <= (int)uVar1) goto LAB_0065aa35;
                      if (local_1310 == (void *)0x0) {
                        pvVar16 = malloc((ulong)uVar1 << 4);
                      }
                      else {
                        pvVar16 = realloc(local_1310,(ulong)uVar1 << 4);
                      }
                    }
                    *(void **)(__ptr + 2) = pvVar16;
                    *__ptr = uVar20;
                  }
LAB_0065aa35:
                  __ptr[1] = uVar6 + 2;
                  *(Gia_Man_t **)(*(long *)(__ptr + 2) + 8 + (long)(int)uVar6 * 8) = pGVar15;
                  local_1378 = local_1378 + 1;
                  bVar3 = true;
LAB_0065aa5d:
                  Gia_ManStopP(&pPVar17->p);
                  if (ThData[uVar19].pCnf != (Cnf_Dat_t *)0x0) {
                    ppCVar22 = &ThData[uVar19].pCnf;
                    Cnf_DataFree(ThData[uVar19].pCnf);
                    iVar7 = 0;
                    goto LAB_0065aa7e;
                  }
                  iVar7 = 9;
                }
                else {
                  if (ThData[uVar19].Result != 0) {
                    dVar4 = ldexp(1.0,iVar7);
                    local_1340 = local_1340 + 1.0 / dVar4;
                    goto LAB_0065aa5d;
                  }
                  ppCVar22 = (Cnf_Dat_t **)&pGVar12->pCexComb;
                  *local_1300 = pGVar12->pCexComb;
                  iVar7 = 10;
                  local_1348 = (uint *)0x0;
LAB_0065aa7e:
                  *ppCVar22 = (Cnf_Dat_t *)0x0;
                }
                if (iVar7 != 0) {
                  if (iVar7 == 9) goto LAB_0065ab00;
                  if (iVar7 == 10) goto LAB_0065aba0;
                  goto LAB_0065a3a5;
                }
              }
              uVar6 = __ptr[1];
              if (uVar6 != 0) {
                if (pPVar17->p != (Gia_Man_t *)0x0) {
                  __assert_fail("ThData[i].p == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                                ,0x2b6,
                                "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)"
                               );
                }
                if ((int)uVar6 < 1) {
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
                }
                __ptr[1] = uVar6 - 1;
                pGVar12 = *(Gia_Man_t **)(*(long *)(__ptr + 2) + (ulong)(uVar6 - 1) * 8);
                pPVar17->p = pGVar12;
                pAVar9 = Gia_ManToAigSimple(pGVar12);
                pAVar9->nRegs = 0;
                pCVar10 = Cnf_Derive(pAVar9,0);
                Aig_ManStop(pAVar9);
                ThData[uVar19].pCnf = pCVar10;
                ThData[uVar19].fWorking = 1;
              }
            }
            else {
              bVar3 = true;
            }
LAB_0065ab00:
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar21);
        }
        if ((nIterMax != 0) && (nIterMax <= (int)local_1378)) goto LAB_0065ab90;
      }
      bVar3 = false;
LAB_0065ab90:
      if (!bVar3) {
        local_1348 = (uint *)0x1;
      }
LAB_0065aba0:
      pPVar17 = ThData;
      if (1 < nProcs) {
        do {
          if (pPVar17->fWorking != 0) {
            __assert_fail("!ThData[i].fWorking",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                          ,0x2c8,
                          "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)")
            ;
          }
          Gia_ManStopP(&pPVar17->p);
          if (pPVar17->pCnf != (Cnf_Dat_t *)0x0) {
            Cnf_DataFree(pPVar17->pCnf);
            pPVar17->p = (Gia_Man_t *)0x0;
            pPVar17->pCnf = (Cnf_Dat_t *)0x0;
            pPVar17->fWorking = 1;
          }
          pPVar17 = pPVar17 + 1;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      uVar6 = __ptr[1];
      if (0 < (long)(int)uVar6) {
        lVar18 = *(long *)(__ptr + 2);
        lVar23 = 0;
        do {
          Gia_ManStop(*(Gia_Man_t **)(lVar18 + lVar23 * 8));
          lVar23 = lVar23 + 1;
        } while ((int)uVar6 != lVar23);
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      __ptr = local_1348;
      if (fSilent == 0) {
        uVar6 = (int)local_1348 + 1;
        if (2 < uVar6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSplit.c"
                        ,0x2dd,
                        "int Cec_GiaSplitTestInt(Gia_Man_t *, int, int, int, int, int, int, int)");
        }
        printf((&PTR_anon_var_dwarf_716e11_00bd6098)[uVar6]);
        printf("after %d case-splits.  ",(ulong)local_1378);
        iVar5 = 3;
        iVar7 = clock_gettime(3,(timespec *)&ts_2);
        if (iVar7 < 0) {
          lVar18 = -1;
        }
        else {
          lVar18 = ts_2.tv_nsec / 1000 + CONCAT44(ts_2.tv_sec._4_4_,(uint)ts_2.tv_sec) * 1000000;
        }
        Abc_Print(iVar5,"%s =","Time");
        Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar18 - local_1358) / 1000000.0,0));
        fflush(_stdout);
      }
    }
    else {
      if (iVar7 == 1) {
        __ptr = (uint *)0x1;
        if (fSilent != 0) goto LAB_0065a3a5;
        __s = "The problem is UNSAT without cofactoring.";
      }
      else {
        __ptr = (uint *)0x0;
        if (fSilent != 0) goto LAB_0065a3a5;
        __s = "The problem is SAT without cofactoring.";
      }
      puts(__s);
    }
  }
LAB_0065a3a5:
  return (int)__ptr;
}

Assistant:

int Cec_GiaSplitTestInt( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Par_ThData_t ThData[PAR_THR_MAX];
    pthread_t WorkerThread[PAR_THR_MAX];
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    double Progress = 0;
    int i, status, nSatVars, nSatConfs;
    int nIter = 0, RetValue = -1, fWorkToDo = 1;
    Abc_CexFreeP( &p->pCexComb );
    if ( fVerbose )
        printf( "Solving CEC problem by cofactoring with the following parameters:\n" );
    if ( fVerbose )
        printf( "Processes = %d   TimeOut = %d sec   MaxIter = %d   LookAhead = %d   Verbose = %d.\n", nProcs, nTimeOut, nIterMax, LookAhead, fVerbose );
    fflush( stdout );
    if ( nProcs == 1 )
        return Cec_GiaSplitTest2( p, nProcs, nTimeOut, nIterMax, LookAhead, fVerbose, fVeryVerbose, fSilent );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= PAR_THR_MAX );
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose && status != -1 )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
        if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
        if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].p        = NULL;
        ThData[i].pCnf     = NULL;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = nTimeOut;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        ThData[i].nVars    = -1;
        ThData[i].nConfs   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cec_GiaSplitWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].p != NULL )
            {
                Gia_Man_t * pLast = ThData[i].p;
                int Depth = pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0;
                if ( pLast->vCofVars == NULL )
                    pLast->vCofVars = Vec_IntAlloc( 100 );
                if ( fVerbose )
                    Cec_GiaSplitPrint( i+1, Depth, ThData[i].nVars, ThData[i].nConfs, ThData[i].Result, Progress, Abc_Clock() - clkTotal );
                if ( ThData[i].Result == 0 ) // SAT
                {
                    p->pCexComb = pLast->pCexComb;  pLast->pCexComb = NULL;
                    RetValue = 0;
                    goto finish;
                }
                if ( ThData[i].Result == -1 ) // UNDEC
                {
                    // determine cofactoring variable
                    int nFanouts, Cost, iVar = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
                    // cofactor
                    Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
                    pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
                    Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
                    Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
                    Vec_PtrPush( vStack, pPart );
                    // print results
                    if ( fVeryVerbose )
                    {
//                        Cec_GiaSplitPrintRefs( pLast );
                        printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                            iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//                        Cec_GiaSplitPrintRefs( pPart );
                    }
                    // cofactor
                    pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
                    pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
                    Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
                    Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
                    Vec_PtrPush( vStack, pPart );
                    // keep working
                    fWorkToDo = 1;
                    nIter++;
                }
                else
                    Progress += 1.0 / pow((double)2, (double)Depth);
                Gia_ManStopP( &ThData[i].p );
                if ( ThData[i].pCnf == NULL )
                    continue;
                Cnf_DataFree( ThData[i].pCnf );
                ThData[i].pCnf = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // start a new thread
            assert( ThData[i].p == NULL );
            ThData[i].p = (Gia_Man_t*)Vec_PtrPop( vStack );
            ThData[i].pCnf = Cec_GiaDeriveGiaRemapped( ThData[i].p );
            ThData[i].fWorking = 1;
        }
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( !fWorkToDo )
        RetValue = 1;
finish:
    // wait till threads finish
    for ( i = 0; i < nProcs; i++ )
        if ( ThData[i].fWorking )
            i = 0;
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // cleanup
        Gia_ManStopP( &ThData[i].p );
        if ( ThData[i].pCnf == NULL )
            continue;
        Cnf_DataFree( ThData[i].pCnf );
        ThData[i].pCnf = NULL;
        // stop
        ThData[i].p = NULL;
        ThData[i].fWorking = 1;
    }
    // finish
    Cec_GiaSplitClean( vStack );
    if ( !fSilent )
    {
        if ( RetValue == 0 )
            printf( "Problem is SAT " );
        else if ( RetValue == 1 )
            printf( "Problem is UNSAT " );
        else if ( RetValue == -1 )
            printf( "Problem is UNDECIDED " );
        else assert( 0 );
        printf( "after %d case-splits.  ", nIter );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
        fflush( stdout );
    }
    return RetValue;
}